

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.h
# Opt level: O2

void __thiscall
Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Graph
          (Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,int vertices)

{
  undefined8 *puVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ulong uVar4;
  ulong *puVar5;
  ulong uVar6;
  GraphVertex<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pGVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  
  uVar10 = (ulong)vertices;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar10;
  uVar4 = SUB168(auVar2 * ZEXT816(0x18),0);
  uVar9 = 0xffffffffffffffff;
  uVar6 = uVar4 + 8;
  if (0xfffffffffffffff7 < uVar4) {
    uVar6 = uVar9;
  }
  this->vertexCount = vertices;
  if (SUB168(auVar2 * ZEXT816(0x18),8) != 0) {
    uVar6 = uVar9;
  }
  puVar5 = (ulong *)operator_new__(uVar6);
  *puVar5 = uVar10;
  if (vertices != 0) {
    lVar8 = 0;
    do {
      *(undefined4 *)((long)puVar5 + lVar8 + 0x18) = 0;
      puVar1 = (undefined8 *)
               ((long)&((SinglyLinkedList<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)(puVar5 + 1))->head + lVar8);
      *puVar1 = 0;
      puVar1[1] = 0;
      lVar8 = lVar8 + 0x18;
    } while (uVar10 * 0x18 - lVar8 != 0);
  }
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar10;
  uVar4 = SUB168(auVar3 * ZEXT816(0x48),0);
  uVar6 = uVar4 + 8;
  if (0xfffffffffffffff7 < uVar4) {
    uVar6 = uVar9;
  }
  this->adjacencyList =
       (SinglyLinkedList<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)(puVar5 + 1);
  if (SUB168(auVar3 * ZEXT816(0x48),8) == 0) {
    uVar9 = uVar6;
  }
  puVar5 = (ulong *)operator_new__(uVar9);
  pGVar7 = (GraphVertex<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)(puVar5 + 1);
  *puVar5 = uVar10;
  if (vertices != 0) {
    puVar5 = puVar5 + 4;
    lVar8 = uVar10 * 0x48;
    do {
      puVar5[-2] = (ulong)puVar5;
      puVar5[-1] = 0;
      *(undefined1 *)puVar5 = 0;
      puVar5[2] = (ulong)(puVar5 + 4);
      puVar5[3] = 0;
      *(undefined1 *)(puVar5 + 4) = 0;
      puVar5 = puVar5 + 9;
      lVar8 = lVar8 + -0x48;
    } while (lVar8 != 0);
  }
  this->vertexList = pGVar7;
  uVar6 = 0;
  uVar9 = (ulong)(uint)vertices;
  if (vertices < 1) {
    uVar9 = uVar6;
  }
  for (; uVar9 != uVar6; uVar6 = uVar6 + 1) {
    pGVar7->index = (int)uVar6;
    pGVar7 = pGVar7 + 1;
  }
  return;
}

Assistant:

Graph<T>::Graph(int vertices)
{
  vertexCount = vertices;
  //we need to allocate the memory for the two arrays
  adjacencyList = new SinglyLinkedList<T>[vertices];
  vertexList = new GraphVertex<T>[vertices];

  for(int i = 0; i<vertexCount; i++)
  {
    //set the index of each vertex in the list to i
    vertexList[i].setIndex(i);
  }
}